

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O1

void __thiscall Js::PropertyRecord::Finalize(PropertyRecord *this,bool isShutdown)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *this_00;
  undefined4 *puVar3;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,isShutdown) != 0) {
    return;
  }
  this_00 = ThreadContext::GetContextForCurrentThread();
  if (this_00 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                                ,0x40,"(tc)","tc");
    if (!bVar2) goto LAB_0078df25;
    *puVar3 = 0;
  }
  bVar2 = ThreadContext::IsActivePropertyId(this_00,this->pid);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                                ,0x41,"(tc->IsActivePropertyId(this->GetPropertyId()))",
                                "tc->IsActivePropertyId(this->GetPropertyId())");
    if (!bVar2) {
LAB_0078df25:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ThreadContext::InvalidatePropertyRecord(this_00,this);
  return;
}

Assistant:

void PropertyRecord::Finalize(bool isShutdown)
    {
        if (!isShutdown)
        {
            ThreadContext * tc = ThreadContext::GetContextForCurrentThread();
            Assert(tc);
            Assert(tc->IsActivePropertyId(this->GetPropertyId()));

            tc->InvalidatePropertyRecord(this);
        }
    }